

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void FunctionalTester<long_long,_void>::Test(void)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char acStack_a8 [8];
  char buf1 [64];
  char buf2 [64];
  TestWatcher<long_long> tw;
  
  TestWatcher<long_long>::TestWatcher((TestWatcher<long_long> *)(buf2 + 0x3f));
  builtin_strncpy(acStack_a8,"-9223372",8);
  builtin_strncpy(buf1,"036854775808",0xd);
  __s = buf1 + 0x38;
  sprintf(__s,"%lld",0x8000000000000000);
  iVar1 = strcmp(acStack_a8,__s);
  if (iVar1 == 0) {
    builtin_strncpy(acStack_a8,"92233720",8);
    builtin_strncpy(buf1,"36854775807",0xc);
    sprintf(__s,"%lld",0x7fffffffffffffff);
    iVar1 = strcmp(acStack_a8,__s);
    if (iVar1 == 0) {
      TestWatcher<long_long>::~TestWatcher((TestWatcher<long_long> *)(buf2 + 0x3f));
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
    sVar2 = strlen(acStack_a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,acStack_a8,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
    sVar2 = strlen(buf1 + 0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,buf1 + 0x38,sVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
    sVar2 = strlen(acStack_a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,acStack_a8,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
    sVar2 = strlen(buf1 + 0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,buf1 + 0x38,sVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(1);
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }